

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::RNEMD::SPFForceManager::updatePotentials(SPFForceManager *this)

{
  long in_RDI;
  SPFForceManager *unaff_retaddr;
  SPFForceManager *in_stack_00000030;
  SPFForceManager *in_stack_000000d0;
  SPFForceManager *in_stack_000000f0;
  
  updateLongRangePotentials(in_stack_000000f0);
  updateShortRangePotentials(in_stack_00000030);
  updateSelfPotentials(in_stack_000000d0);
  updateExcludedPotentials(in_stack_000000d0);
  updateRestraintPotentials(unaff_retaddr);
  if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
    updateSelectionPotentials(in_stack_000000d0);
  }
  return;
}

Assistant:

void SPFForceManager::updatePotentials() {
    updateLongRangePotentials();
    updateShortRangePotentials();
    updateSelfPotentials();
    updateExcludedPotentials();
    updateRestraintPotentials();
    if (doPotentialSelection_) updateSelectionPotentials();
  }